

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O2

void __thiscall
Sequence::process_cluster_list2
          (Sequence *this,shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *hdr1,int i,
          Eqclass_SS *EQ,shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster,
          shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL,int iter,int eqtype,
          Eqclass_S *parent)

{
  Env *seqstrm;
  element_type *peVar1;
  element_type *peVar2;
  Eqclass *pEVar3;
  Lists<std::shared_ptr<Eqclass>_> *this_00;
  element_type *peVar4;
  uint uVar5;
  size_type __n;
  reference pvVar6;
  reference pvVar7;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *psVar8;
  __shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  Sequence *this_01;
  element_type *__n_00;
  undefined1 local_128 [16];
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> hdr2;
  Itemset_S mjoin;
  Itemset_S ejoin;
  element_type *local_e0;
  Itemset_S ljoin;
  int msup;
  int esup;
  int lsup;
  shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *local_a0;
  shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> local_98;
  __shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  seqstrm = this->env;
  hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a0 = LargeL;
  std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&hdr2.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>,
             &hdr1->
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>);
  __n_00 = (element_type *)(long)i;
  __n = (size_type)(iter + -1);
  local_e0 = __n_00;
  while (peVar2 = hdr2.
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,
        hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
    peVar1 = (hdr1->
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                       ((EQ->
                        super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr,(size_type)local_e0);
    uVar5 = Eqclass::templ((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    prune_decision((Sequence *)local_128,(Itemset_S *)this,&peVar1->theItem,(int)peVar2 + 0x10,uVar5
                  );
    std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    peVar1 = hdr2.
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar2 = (hdr1->
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (hdr2.super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == peVar2) {
      local_128._0_8_ = (Env *)0x0;
      local_128._8_8_ = (element_type *)0x0;
      std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_128);
      std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                 &mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
    }
    else {
      pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                         ((EQ->
                          super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr,(size_type)__n_00);
      uVar5 = Eqclass::templ2((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
      prune_decision((Sequence *)local_128,(Itemset_S *)this,&peVar1->theItem,(int)peVar2 + 0x10,
                     uVar5);
      std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
      peVar1 = hdr2.
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      peVar2 = (hdr1->
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr;
      pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                         ((EQ->
                          super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr,(size_type)__n_00);
      uVar5 = Eqclass::templ((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
      prune_decision((Sequence *)local_128,(Itemset_S *)this,&peVar1->theItem,(int)peVar2 + 0x10,
                     uVar5);
      std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_128);
    }
    this_01 = (Sequence *)(local_128 + 8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
    msup = 0;
    esup = 0;
    lsup = 0;
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                         ((EQ->
                          super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr,(size_type)__n_00);
      uVar5 = Eqclass::templ2((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
      pre_pruning(this,&ejoin,uVar5,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem,
                  &(hdr2.
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->theItem,'\0');
      pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                         ((EQ->
                          super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr,(size_type)local_e0);
      uVar5 = Eqclass::templ((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
      pre_pruning(this,&ljoin,uVar5,
                  &(hdr2.
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->theItem,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem,'\x01');
      pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                         ((EQ->
                          super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr,(size_type)__n_00);
      uVar5 = Eqclass::templ((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
      this_01 = this;
      pre_pruning(this,&mjoin,uVar5,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem,
                  &(hdr2.
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->theItem,'\x01');
    }
    if (((ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) ||
        (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
        )) || (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)0x0)) {
      this_01 = this;
      get_tmpnewf_intersect
                (this,&ljoin,&ejoin,&mjoin,&lsup,&esup,&msup,
                 &((hdr1->
                   super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->theItem,
                 &(hdr2.
                   super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->theItem,iter);
      if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        fill_join(this_01,&ljoin,
                  &(hdr2.
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->theItem,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem);
      }
    }
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                         ((EQ->
                          super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr,(size_type)local_e0);
      uVar5 = Eqclass::templ((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
      this_01 = this;
      post_pruning(this,&ljoin,uVar5);
    }
    if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      pvVar7 = std::vector<int,_std::allocator<int>_>::at
                         ((this->numLargeItemset).
                          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,__n);
      peVar4 = ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *pvVar7 = *pvVar7 + 1;
      if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          outputfreq != '\0') {
        pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                 at((EQ->
                    super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr,(size_type)local_e0);
        uVar5 = Eqclass::templ((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
        Itemset::print_seq(peVar4,(ostream *)seqstrm,uVar5);
      }
      pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                         ((EQ->
                          super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr,(size_type)local_e0);
      pEVar3 = (pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_40,
                 &ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
      Eqclass::append(pEVar3,(Itemset_S *)local_40);
      this_01 = (Sequence *)(local_40 + 8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      fill_join(this_01,&ejoin,
                &((hdr1->
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->theItem,
                &(hdr2.
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->theItem);
    }
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                         ((EQ->
                          super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr,(size_type)__n_00);
      uVar5 = Eqclass::templ2((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr);
      this_01 = this;
      post_pruning(this,&ejoin,uVar5);
    }
    if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      pvVar7 = std::vector<int,_std::allocator<int>_>::at
                         ((this->numLargeItemset).
                          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,__n);
      peVar4 = ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *pvVar7 = *pvVar7 + 1;
      if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          outputfreq != '\0') {
        pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                 at((EQ->
                    super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr,(size_type)__n_00);
        uVar5 = Eqclass::templ2((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
        Itemset::print_seq(peVar4,(ostream *)seqstrm,uVar5);
      }
      pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                         ((EQ->
                          super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr,(size_type)__n_00);
      pEVar3 = (pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2> *)local_50,
                 &ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
      Eqclass::append2(pEVar3,(Itemset_S *)local_50);
      this_01 = (Sequence *)(local_50 + 8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      fill_join(this_01,&mjoin,
                &((hdr1->
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->theItem,
                &(hdr2.
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->theItem);
    }
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                         ((EQ->
                          super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr,(size_type)__n_00);
      uVar5 = Eqclass::templ((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
      post_pruning(this,&mjoin,uVar5);
    }
    if (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      pvVar7 = std::vector<int,_std::allocator<int>_>::at
                         ((this->numLargeItemset).
                          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,__n);
      peVar4 = mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *pvVar7 = *pvVar7 + 1;
      if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          outputfreq != '\0') {
        pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                 at((EQ->
                    super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr,(size_type)__n_00);
        uVar5 = Eqclass::templ((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
        Itemset::print_seq(peVar4,(ostream *)seqstrm,uVar5);
      }
      pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                         ((EQ->
                          super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr,(size_type)__n_00);
      pEVar3 = (pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,&mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>);
      Eqclass::append(pEVar3,(Itemset_S *)&local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    }
    local_e0 = (element_type *)
               ((long)&(local_e0->theArray).
                       super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 1);
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 local_128,
                 (__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                 hdr2.
                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    std::__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&hdr2.
                super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
               ,(__shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2> *)
                local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
  }
  pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                     ((EQ->
                      super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr,(size_type)__n_00);
  psVar8 = Eqclass::list((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (((psVar8->super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->theSize < 1) {
    pvVar6 = std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                       ((EQ->
                        super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr,(size_type)__n_00);
    psVar8 = Eqclass::list2((pvVar6->super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                           );
    if (0 < ((psVar8->
             super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->theSize) goto LAB_0010edb5;
    local_128._0_8_ = (Env *)0x0;
    local_128._8_8_ = (element_type *)0x0;
    p_Var9 = &std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                        ((EQ->
                         super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr,(size_type)__n_00)->
              super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>;
  }
  else {
LAB_0010edb5:
    if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        recursive == 0) {
      this_00 = (local_a0->
                super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      p_Var9 = &std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::
                at((EQ->
                   super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr,(size_type)__n_00)->
                super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_80,p_Var9);
      Lists<std::shared_ptr<Eqclass>_>::append(this_00,(shared_ptr<Eqclass> *)&local_80);
      p_Var9 = &local_80;
      goto LAB_0010ee91;
    }
    p_Var9 = &std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                        ((EQ->
                         super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr,(size_type)__n_00)->
              super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_70,p_Var9);
    local_98.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_98.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    process_cluster1(this,(Eqclass_S *)&local_70,&local_98,iter + 1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_98.
                super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    local_128._0_8_ = (Env *)0x0;
    local_128._8_8_ = (element_type *)0x0;
    p_Var9 = &std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>::at
                        ((EQ->
                         super___shared_ptr<std::vector<std::shared_ptr<Eqclass>,_std::allocator<std::shared_ptr<Eqclass>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr,(size_type)__n_00)->
              super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var9,(__shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> *)local_128);
  p_Var9 = (__shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> *)local_128;
LAB_0010ee91:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var9->_M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&hdr2.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Sequence::process_cluster_list2(shared_ptr<ListNodes<shared_ptr<Itemset>>>& hdr1, int i, Eqclass_SS& EQ,
                                     shared_ptr<Lists<shared_ptr<Itemset>>>& cluster,
                                     shared_ptr<Lists<Eqclass_S>>& LargeL,
                                     int iter, int eqtype, Eqclass_S& parent) {
    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    int j;
    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr2;
    Itemset_S ljoin, ejoin, mjoin;
    int lsup, esup, msup;

    //join with sequences
    hdr2 = hdr1;
    for (j = i; hdr2; j++, hdr2 = hdr2->next()) {
        ljoin = prune_decision(hdr1->item(), hdr2->item(), EQ->at(j)->templ(), LJOIN);
        if (hdr2 == hdr1) {
            ejoin = mjoin = nullptr;
        } else {
            ejoin = prune_decision(hdr2->item(), hdr1->item(), EQ->at(i)->templ2(), EJOIN);
            mjoin = prune_decision(hdr2->item(), hdr1->item(), EQ->at(i)->templ(), MJOIN);
            //ejoin = mjoin = (Itemset_S )1;
        }
        lsup = esup = msup = 0;
        if (args->pruning_type > 1) {
            pre_pruning(ejoin, EQ->at(i)->templ2(), hdr1->item(), hdr2->item(), 0);
            pre_pruning(ljoin, EQ->at(j)->templ(), hdr2->item(), hdr1->item(), 1);
            pre_pruning(mjoin, EQ->at(i)->templ(), hdr1->item(), hdr2->item(), 1);
        }

        if (ljoin || ejoin || mjoin) get_tmpnewf_intersect(ljoin, ejoin, mjoin, lsup, esup, msup, hdr1->item(), hdr2->item(), iter);
        if (ljoin) fill_join(ljoin, hdr2->item(), hdr1->item());
        if (args->pruning_type > 1) post_pruning(ljoin, EQ->at(j)->templ());
        if (ljoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ljoin, hdr2->item(), hdr1->item());
            if (args->outputfreq) ljoin->print_seq(seqstrm, EQ->at(j)->templ());
            EQ->at(j)->append(ljoin);
        }

        if (ejoin) fill_join(ejoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) post_pruning(ejoin, EQ->at(i)->templ2());
        if (ejoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ejoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) ejoin->print_seq(seqstrm, EQ->at(i)->templ2());
            EQ->at(i)->append2(ejoin);
        }

        if (mjoin) fill_join(mjoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) post_pruning(mjoin, EQ->at(i)->templ());
        if (mjoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(mjoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) mjoin->print_seq(seqstrm, EQ->at(i)->templ());
            EQ->at(i)->append(mjoin);
        }
    }
    if ((EQ->at(i)->list()->size() > 0) || (EQ->at(i)->list2()->size() > 0)) {
        if (args->recursive) {
            //if (use_hash) insert_freqarray(EQ->at(i));
            process_cluster1(EQ->at(i), nullptr, iter + 1);
            EQ->at(i) = nullptr;
        } else LargeL->append(EQ->at(i));
    } else {
        EQ->at(i) = nullptr;
    }

}